

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server_socket.c
# Opt level: O3

cio_error cio_server_socket_set_tcp_fast_open(cio_server_socket *server_socket,_Bool on)

{
  int iVar1;
  cio_error cVar2;
  int *piVar3;
  undefined1 local_4 [4];
  
  iVar1 = setsockopt((server_socket->impl).ev.fd,6,0x17,local_4,4);
  cVar2 = CIO_SUCCESS;
  if (iVar1 != 0) {
    piVar3 = __errno_location();
    cVar2 = -*piVar3;
  }
  return cVar2;
}

Assistant:

enum cio_error cio_server_socket_set_tcp_fast_open(const struct cio_server_socket *server_socket, bool on)
{
	int qlen = 0;
	if (on) {
		qlen = CONFIG_TCP_FASTOPEN_QUEUE_SIZE;
	}

	int ret = setsockopt(server_socket->impl.ev.fd, SOL_TCP, TCP_FASTOPEN, &qlen, sizeof(qlen));
	if (cio_unlikely(ret != 0)) {
		return (enum cio_error)(-errno);
	}

	return CIO_SUCCESS;
}